

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O0

void __thiscall
leveldb::_Test_ConsumeDecimalNumberRoundtrip::_Run(_Test_ConsumeDecimalNumberRoundtrip *this)

{
  unsigned_long uVar1;
  uint64_t number;
  allocator local_3c9;
  string local_3c8 [32];
  uint64_t local_3a8;
  uint64_t large_number;
  uint64_t i;
  Tester local_378;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  _Test_ConsumeDecimalNumberRoundtrip *local_10;
  _Test_ConsumeDecimalNumberRoundtrip *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  ConsumeDecimalNumberRoundtripTest(0,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  ConsumeDecimalNumberRoundtripTest(1,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  ConsumeDecimalNumberRoundtripTest(9,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_b9);
  ConsumeDecimalNumberRoundtripTest(10,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"",&local_e1);
  ConsumeDecimalNumberRoundtripTest(0xb,(string *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"",&local_109);
  ConsumeDecimalNumberRoundtripTest(0x13,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"",&local_131);
  ConsumeDecimalNumberRoundtripTest(99,(string *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"",&local_159);
  ConsumeDecimalNumberRoundtripTest(100,(string *)local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"",&local_181);
  ConsumeDecimalNumberRoundtripTest(0x6d,(string *)local_180);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"",&local_1a9);
  ConsumeDecimalNumberRoundtripTest(0xbe,(string *)local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"",&local_1d1);
  ConsumeDecimalNumberRoundtripTest(0x7b,(string *)local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  test::Tester::Tester
            (&local_378,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
             ,0x44);
  NumberToString_abi_cxx11_((leveldb *)&i,0xbc614e);
  test::Tester::IsEq<char[9],std::__cxx11::string>
            (&local_378,(char (*) [9])"12345678",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  std::__cxx11::string::~string((string *)&i);
  test::Tester::~Tester(&local_378);
  for (large_number = 0; large_number < 100; large_number = large_number + 1) {
    uVar1 = std::numeric_limits<unsigned_long>::max();
    number = uVar1 - large_number;
    local_3a8 = number;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c8,"",&local_3c9);
    ConsumeDecimalNumberRoundtripTest(number,(string *)local_3c8);
    std::__cxx11::string::~string(local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  }
  return;
}

Assistant:

TEST(Logging, ConsumeDecimalNumberRoundtrip) {
  ConsumeDecimalNumberRoundtripTest(0);
  ConsumeDecimalNumberRoundtripTest(1);
  ConsumeDecimalNumberRoundtripTest(9);

  ConsumeDecimalNumberRoundtripTest(10);
  ConsumeDecimalNumberRoundtripTest(11);
  ConsumeDecimalNumberRoundtripTest(19);
  ConsumeDecimalNumberRoundtripTest(99);

  ConsumeDecimalNumberRoundtripTest(100);
  ConsumeDecimalNumberRoundtripTest(109);
  ConsumeDecimalNumberRoundtripTest(190);
  ConsumeDecimalNumberRoundtripTest(123);
  ASSERT_EQ("12345678", NumberToString(12345678));

  for (uint64_t i = 0; i < 100; ++i) {
    uint64_t large_number = std::numeric_limits<uint64_t>::max() - i;
    ConsumeDecimalNumberRoundtripTest(large_number);
  }
}